

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O0

void __thiscall
ikfast::IkSolution<double>::GetSolutionIndices
          (IkSolution<double> *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  byte bVar1;
  value_type vVar2;
  size_t sVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  ulong local_48;
  size_t j_2;
  ulong local_38;
  size_t j_1;
  size_t orgsize;
  size_t j;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v_local;
  IkSolution<double> *this_local;
  
  _i = v;
  v_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(v,0);
  j._4_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (_i,(value_type_conflict2 *)((long)&j + 4));
  sVar4 = std::
          vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
          ::size(&this->_vbasesol);
  j._0_4_ = (int)sVar4;
  while (j._0_4_ = (int)j + -1, -1 < (int)j) {
    pvVar5 = std::
             vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
             ::operator[](&this->_vbasesol,(long)(int)j);
    if ((pvVar5->maxsolutions != 0xff) &&
       (pvVar5 = std::
                 vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                 ::operator[](&this->_vbasesol,(long)(int)j), 1 < pvVar5->maxsolutions)) {
      for (orgsize = 0; sVar3 = orgsize,
          sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_i), sVar3 < sVar4;
          orgsize = orgsize + 1) {
        pvVar5 = std::
                 vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                 ::operator[](&this->_vbasesol,(long)(int)j);
        bVar1 = pvVar5->maxsolutions;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_i,orgsize);
        *pvVar6 = (uint)bVar1 * *pvVar6;
      }
      j_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_i);
      pvVar5 = std::
               vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
               ::operator[](&this->_vbasesol,(long)(int)j);
      if (pvVar5->indices[1] != 0xff) {
        for (local_38 = 0; this_00 = _i, local_38 < j_1; local_38 = local_38 + 1) {
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_i,local_38)
          ;
          vVar2 = *pvVar6;
          pvVar5 = std::
                   vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                   ::operator[](&this->_vbasesol,(long)(int)j);
          j_2._4_4_ = vVar2 + pvVar5->indices[1];
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (this_00,(value_type_conflict2 *)((long)&j_2 + 4));
        }
      }
      pvVar5 = std::
               vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
               ::operator[](&this->_vbasesol,(long)(int)j);
      if (pvVar5->indices[0] != 0xff) {
        for (local_48 = 0; local_48 < j_1; local_48 = local_48 + 1) {
          pvVar5 = std::
                   vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                   ::operator[](&this->_vbasesol,(long)(int)j);
          bVar1 = pvVar5->indices[0];
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_i,local_48)
          ;
          *pvVar6 = (uint)bVar1 + *pvVar6;
        }
      }
    }
  }
  return;
}

Assistant:

virtual void GetSolutionIndices(std::vector<unsigned int>& v) const {
        v.resize(0);
        v.push_back(0);
        for(int i = (int)_vbasesol.size()-1; i >= 0; --i) {
            if( _vbasesol[i].maxsolutions != (unsigned char)-1 && _vbasesol[i].maxsolutions > 1 ) {
                for(size_t j = 0; j < v.size(); ++j) {
                    v[j] *= _vbasesol[i].maxsolutions;
                }
                size_t orgsize=v.size();
                if( _vbasesol[i].indices[1] != (unsigned char)-1 ) {
                    for(size_t j = 0; j < orgsize; ++j) {
                        v.push_back(v[j]+_vbasesol[i].indices[1]);
                    }
                }
                if( _vbasesol[i].indices[0] != (unsigned char)-1 ) {
                    for(size_t j = 0; j < orgsize; ++j) {
                        v[j] += _vbasesol[i].indices[0];
                    }
                }
            }
        }
    }